

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::fe::FeHierarchicSegment<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          FeHierarchicSegment<double> *this,MatrixXd *refcoords)

{
  XprTypeNested pMVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Index cols;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  uint uVar6;
  variable_if_dynamic<long,__1> vVar7;
  double *pdVar8;
  double *pdVar9;
  Index col;
  long lVar10;
  double dVar11;
  stringstream ss;
  undefined1 local_230 [32];
  string local_210;
  Matrix<double,__1,__1,_0,__1,__1> *local_1f0;
  string local_1e8;
  FeHierarchicSegment<double> *local_1c8;
  MatrixXd *local_1c0;
  undefined1 local_1b8 [16];
  variable_if_dynamic<long,__1> local_1a8;
  XprTypeNested local_1a0;
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      == 1) {
    uVar6 = this->degree_;
    cols = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(ulong)(uVar6 + 1),
               cols);
    local_230._0_8_ = refcoords;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               __return_storage_ptr__,0);
    pdVar9 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_data;
    lVar3 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicSegment<double>::EvalReferenceShapeFunctions(Eigen::Matrix<double,_1,_1,0,_1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:301:29),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_230,(assign_op<double,_double> *)&local_210);
    if (0 < local_1a8.m_value) {
      lVar4 = (local_1a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      vVar7.m_value = local_1a8.m_value;
      pdVar8 = (double *)local_1b8._0_8_;
      do {
        *pdVar8 = 1.0 - *pdVar9;
        pdVar9 = pdVar9 + lVar3;
        pdVar8 = pdVar8 + lVar4;
        vVar7.m_value = vVar7.m_value + -1;
      } while (vVar7.m_value != 0);
    }
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               __return_storage_ptr__,1);
    pdVar9 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_data;
    lVar3 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,refcoords,
               (assign_op<double,_double> *)local_230);
    if (0 < local_1a8.m_value) {
      lVar4 = (local_1a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      vVar7.m_value = local_1a8.m_value;
      pdVar8 = (double *)local_1b8._0_8_;
      do {
        *pdVar8 = *pdVar9;
        pdVar9 = pdVar9 + lVar3;
        pdVar8 = pdVar8 + lVar4;
        vVar7.m_value = vVar7.m_value + -1;
      } while (vVar7.m_value != 0);
    }
    local_210._M_dataplus._M_p = (pointer)((ulong)local_210._M_dataplus._M_p._4_4_ << 0x20);
    if (this->degree_ != 1) {
      uVar6 = 0;
      local_1f0 = __return_storage_ptr__;
      local_1c8 = this;
      local_1c0 = refcoords;
      do {
        local_230._8_8_ = &local_210;
        local_230._0_8_ = local_1c0;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
                   local_1f0,(long)(int)(uVar6 + 2));
        uVar5 = local_230._8_8_;
        pdVar9 = *(double **)local_230._0_8_;
        lVar3 = *(Index *)(local_230._0_8_ + 8);
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicSegment<double>::EvalReferenceShapeFunctions(Eigen::Matrix<double,_1,_1,0,_1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
                   (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:306:11),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_230,(assign_op<double,_double> *)&local_1e8);
        if (0 < local_1a8.m_value) {
          lVar4 = (local_1a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                  m_storage.m_rows;
          lVar10 = 0;
          pdVar8 = (double *)local_1b8._0_8_;
          do {
            dVar11 = ILegendre(*(int *)uVar5 + 2,*pdVar9,1.0);
            *pdVar8 = dVar11;
            lVar10 = lVar10 + 1;
            pdVar9 = pdVar9 + lVar3;
            pdVar8 = pdVar8 + lVar4;
          } while (lVar10 < local_1a8.m_value);
        }
        uVar6 = (uint)local_210._M_dataplus._M_p + 1;
        local_210._M_dataplus._M_p._0_4_ = uVar6;
        __return_storage_ptr__ = local_1f0;
      } while (uVar6 < local_1c8->degree_ - 1);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"refcoords must be a row vector",0x1e);
  pMVar1 = (XprTypeNested)(local_230 + 0x10);
  local_230._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"refcoords.rows() == 1","");
  paVar2 = &local_210.field_2;
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_230,&local_210,0x128,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((XprTypeNested)local_230._0_8_ != pMVar1) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  local_230._0_8_ = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"false","");
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_fe.h"
             ,"");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
  base::AssertionFailed((string *)local_230,&local_210,0x128,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_230);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd &refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 1, "refcoords must be a row vector");
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(
        NumRefShapeFunctions(), refcoords.cols());
    // Get the shape functions associated with the vertices
    result.row(0) =
        refcoords.unaryExpr([&](double x) -> SCALAR { return 1 - x; });
    result.row(1) = refcoords;
    // Get the shape functions associated with the interior of the segment
    for (int i = 0; i < degree_ - 1; ++i) {
      result.row(i + 2) = refcoords.unaryExpr(
          [&](double x) -> SCALAR { return ILegendre(i + 2, x); });
    }
    return result;
  }